

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O2

void Imf_3_2::anon_unknown_9::dctInverse8x8_sse2<3>(float *data)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined8 uVar3;
  int col;
  long lVar4;
  float *pfVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fStack_88;
  float fStack_84;
  __m128 in [8];
  
  fVar37 = data[1];
  fVar29 = data[2];
  fVar11 = data[3];
  fVar32 = data[4];
  fVar22 = data[5];
  fVar34 = data[6];
  fVar27 = data[7];
  fVar30 = data[9];
  fVar10 = data[10];
  fVar12 = data[0xb];
  fVar13 = data[0xc];
  fVar7 = data[0xd];
  fVar8 = data[0xe];
  fVar9 = data[0xf];
  fVar20 = *data * 0.3535536 + 0.0;
  fVar21 = fVar20 + fVar29 * 0.4619398 + fVar32 * 0.3535536 + fVar34 * 0.1913422;
  fVar24 = fVar20 + fVar29 * 0.1913422 + fVar32 * -0.3535536 + fVar34 * -0.4619398;
  fVar26 = fVar20 + fVar29 * -0.1913422 + fVar32 * -0.3535536 + fVar34 * 0.4619398;
  fVar29 = fVar20 + fVar29 * -0.4619398 + fVar32 * 0.3535536 + fVar34 * -0.1913422;
  fVar32 = fVar37 * 0.4903927 + 0.0 + fVar11 * 0.4157349 + fVar22 * 0.2777855 + fVar27 * 0.09754573;
  fVar34 = fVar37 * 0.4157349 + 0.0 + fVar11 * -0.09754573 + fVar22 * -0.4903927 +
           fVar27 * -0.2777855;
  fVar20 = fVar37 * 0.2777855 + 0.0 + fVar11 * -0.4903927 + fVar22 * 0.09754573 + fVar27 * 0.4157349
  ;
  fVar37 = fVar37 * 0.09754573 + 0.0 + fVar11 * -0.2777855 + fVar22 * 0.4157349 +
           fVar27 * -0.4903927;
  *data = fVar21 + fVar32;
  data[1] = fVar24 + fVar34;
  data[2] = fVar26 + fVar20;
  data[3] = fVar29 + fVar37;
  data[4] = fVar29 - fVar37;
  data[5] = fVar26 - fVar20;
  data[6] = fVar24 - fVar34;
  data[7] = fVar21 - fVar32;
  fVar37 = data[8] * 0.3535536 + 0.0;
  fVar29 = fVar37 + fVar10 * 0.4619398 + fVar13 * 0.3535536 + fVar8 * 0.1913422;
  fVar11 = fVar37 + fVar10 * 0.1913422 + fVar13 * -0.3535536 + fVar8 * -0.4619398;
  fVar32 = fVar37 + fVar10 * -0.1913422 + fVar13 * -0.3535536 + fVar8 * 0.4619398;
  fVar37 = fVar37 + fVar10 * -0.4619398 + fVar13 * 0.3535536 + fVar8 * -0.1913422;
  fVar22 = fVar30 * 0.4903927 + 0.0 + fVar12 * 0.4157349 + fVar7 * 0.2777855 + fVar9 * 0.09754573;
  fVar34 = fVar30 * 0.4157349 + 0.0 + fVar12 * -0.09754573 + fVar7 * -0.4903927 + fVar9 * -0.2777855
  ;
  fVar27 = fVar30 * 0.2777855 + 0.0 + fVar12 * -0.4903927 + fVar7 * 0.09754573 + fVar9 * 0.4157349;
  fVar30 = fVar30 * 0.09754573 + 0.0 + fVar12 * -0.2777855 + fVar7 * 0.4157349 + fVar9 * -0.4903927;
  data[8] = fVar29 + fVar22;
  data[9] = fVar11 + fVar34;
  data[10] = fVar32 + fVar27;
  data[0xb] = fVar37 + fVar30;
  data[0xc] = fVar37 - fVar30;
  data[0xd] = fVar32 - fVar27;
  data[0xe] = fVar11 - fVar34;
  data[0xf] = fVar29 - fVar22;
  fVar37 = data[0x11];
  fVar29 = data[0x12];
  fVar11 = data[0x13];
  fVar32 = data[0x14];
  fVar22 = data[0x15];
  fVar34 = data[0x16];
  fVar27 = data[0x17];
  fVar30 = data[0x10] * 0.3535536 + 0.0;
  fVar10 = fVar30 + fVar29 * 0.4619398 + fVar32 * 0.3535536 + fVar34 * 0.1913422;
  fVar12 = fVar30 + fVar29 * 0.1913422 + fVar32 * -0.3535536 + fVar34 * -0.4619398;
  fVar13 = fVar30 + fVar29 * -0.1913422 + fVar32 * -0.3535536 + fVar34 * 0.4619398;
  fVar29 = fVar30 + fVar29 * -0.4619398 + fVar32 * 0.3535536 + fVar34 * -0.1913422;
  fVar32 = fVar37 * 0.4903927 + 0.0 + fVar11 * 0.4157349 + fVar22 * 0.2777855 + fVar27 * 0.09754573;
  fVar34 = fVar37 * 0.4157349 + 0.0 + fVar11 * -0.09754573 + fVar22 * -0.4903927 +
           fVar27 * -0.2777855;
  fVar30 = fVar37 * 0.2777855 + 0.0 + fVar11 * -0.4903927 + fVar22 * 0.09754573 + fVar27 * 0.4157349
  ;
  fVar37 = fVar37 * 0.09754573 + 0.0 + fVar11 * -0.2777855 + fVar22 * 0.4157349 +
           fVar27 * -0.4903927;
  data[0x10] = fVar10 + fVar32;
  data[0x11] = fVar12 + fVar34;
  data[0x12] = fVar13 + fVar30;
  data[0x13] = fVar29 + fVar37;
  data[0x14] = fVar29 - fVar37;
  data[0x15] = fVar13 - fVar30;
  data[0x16] = fVar12 - fVar34;
  data[0x17] = fVar10 - fVar32;
  fVar37 = data[0x19];
  fVar29 = data[0x1a];
  fVar11 = data[0x1b];
  fVar32 = data[0x1c];
  fVar22 = data[0x1d];
  fVar34 = data[0x1e];
  fVar27 = data[0x1f];
  fVar30 = data[0x18] * 0.3535536 + 0.0;
  fVar10 = fVar30 + fVar29 * 0.4619398 + fVar32 * 0.3535536 + fVar34 * 0.1913422;
  fVar12 = fVar30 + fVar29 * 0.1913422 + fVar32 * -0.3535536 + fVar34 * -0.4619398;
  fVar13 = fVar30 + fVar29 * -0.1913422 + fVar32 * -0.3535536 + fVar34 * 0.4619398;
  fVar29 = fVar30 + fVar29 * -0.4619398 + fVar32 * 0.3535536 + fVar34 * -0.1913422;
  fVar32 = fVar37 * 0.4903927 + 0.0 + fVar11 * 0.4157349 + fVar22 * 0.2777855 + fVar27 * 0.09754573;
  fVar34 = fVar37 * 0.4157349 + 0.0 + fVar11 * -0.09754573 + fVar22 * -0.4903927 +
           fVar27 * -0.2777855;
  fVar30 = fVar37 * 0.2777855 + 0.0 + fVar11 * -0.4903927 + fVar22 * 0.09754573 + fVar27 * 0.4157349
  ;
  fVar37 = fVar37 * 0.09754573 + 0.0 + fVar11 * -0.2777855 + fVar22 * 0.4157349 +
           fVar27 * -0.4903927;
  data[0x18] = fVar10 + fVar32;
  data[0x19] = fVar12 + fVar34;
  data[0x1a] = fVar13 + fVar30;
  data[0x1b] = fVar29 + fVar37;
  data[0x1c] = fVar29 - fVar37;
  data[0x1d] = fVar13 - fVar30;
  data[0x1e] = fVar12 - fVar34;
  data[0x1f] = fVar10 - fVar32;
  fVar37 = data[0x21];
  fVar29 = data[0x22];
  fVar11 = data[0x23];
  fVar32 = data[0x24];
  fVar22 = data[0x25];
  fVar34 = data[0x26];
  fVar27 = data[0x27];
  fVar30 = data[0x20] * 0.3535536 + 0.0;
  fVar10 = fVar30 + fVar29 * 0.4619398 + fVar32 * 0.3535536 + fVar34 * 0.1913422;
  fVar12 = fVar30 + fVar29 * 0.1913422 + fVar32 * -0.3535536 + fVar34 * -0.4619398;
  fVar13 = fVar30 + fVar29 * -0.1913422 + fVar32 * -0.3535536 + fVar34 * 0.4619398;
  fVar30 = fVar30 + fVar29 * -0.4619398 + fVar32 * 0.3535536 + fVar34 * -0.1913422;
  fVar29 = fVar37 * 0.4903927 + 0.0 + fVar11 * 0.4157349 + fVar22 * 0.2777855 + fVar27 * 0.09754573;
  fVar32 = fVar37 * 0.4157349 + 0.0 + fVar11 * -0.09754573 + fVar22 * -0.4903927 +
           fVar27 * -0.2777855;
  fVar34 = fVar37 * 0.2777855 + 0.0 + fVar11 * -0.4903927 + fVar22 * 0.09754573 + fVar27 * 0.4157349
  ;
  fVar37 = fVar37 * 0.09754573 + 0.0 + fVar11 * -0.2777855 + fVar22 * 0.4157349 +
           fVar27 * -0.4903927;
  data[0x20] = fVar10 + fVar29;
  data[0x21] = fVar12 + fVar32;
  data[0x22] = fVar13 + fVar34;
  data[0x23] = fVar30 + fVar37;
  data[0x24] = fVar30 - fVar37;
  data[0x25] = fVar13 - fVar34;
  data[0x26] = fVar12 - fVar32;
  data[0x27] = fVar10 - fVar29;
  pfVar5 = data;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 0x10) {
      puVar1 = (undefined8 *)((long)pfVar5 + lVar6 * 2);
      uVar3 = puVar1[1];
      *(undefined8 *)((long)in[-1] + lVar6 + 8) = *puVar1;
      *(undefined8 *)((long)in[0] + lVar6) = uVar3;
    }
    fVar8 = in[1][2] * 0.1913422 - in[5][2] * 0.4619398;
    fVar9 = in[1][3] * 0.1913422 - in[5][3] * 0.4619398;
    fVar20 = in[2][0] * 0.1913422 - in[6][0] * 0.4619398;
    fVar21 = in[2][1] * 0.1913422 - in[6][1] * 0.4619398;
    fVar24 = in[5][2] * 0.1913422 + in[1][2] * 0.4619398;
    fVar26 = in[5][3] * 0.1913422 + in[1][3] * 0.4619398;
    fVar14 = in[6][0] * 0.1913422 + in[2][0] * 0.4619398;
    fVar15 = in[6][1] * 0.1913422 + in[2][1] * 0.4619398;
    fVar37 = in[6][2] * 0.09754573 + in[4][2] * 0.2777855 +
             in[2][2] * 0.4157349 + in[0][2] * 0.4903927;
    fVar29 = in[6][3] * 0.09754573 + in[4][3] * 0.2777855 +
             in[2][3] * 0.4157349 + in[0][3] * 0.4903927;
    fVar11 = in[7][0] * 0.09754573 + in[5][0] * 0.2777855 +
             in[3][0] * 0.4157349 + in[1][0] * 0.4903927;
    fVar32 = in[7][1] * 0.09754573 + in[5][1] * 0.2777855 +
             in[3][1] * 0.4157349 + in[1][1] * 0.4903927;
    fVar16 = (in[0][2] * 0.4157349 - in[2][2] * 0.09754573) -
             (in[6][2] * 0.2777855 + in[4][2] * 0.4903927);
    fVar17 = (in[0][3] * 0.4157349 - in[2][3] * 0.09754573) -
             (in[6][3] * 0.2777855 + in[4][3] * 0.4903927);
    fVar18 = (in[1][0] * 0.4157349 - in[3][0] * 0.09754573) -
             (in[7][0] * 0.2777855 + in[5][0] * 0.4903927);
    fVar19 = (in[1][1] * 0.4157349 - in[3][1] * 0.09754573) -
             (in[7][1] * 0.2777855 + in[5][1] * 0.4903927);
    fVar39 = in[6][2] * 0.4157349 + in[4][2] * 0.09754573 +
             (in[0][2] * 0.2777855 - in[2][2] * 0.4903927);
    fVar40 = in[6][3] * 0.4157349 + in[4][3] * 0.09754573 +
             (in[0][3] * 0.2777855 - in[2][3] * 0.4903927);
    fVar41 = in[7][0] * 0.4157349 + in[5][0] * 0.09754573 +
             (in[1][0] * 0.2777855 - in[3][0] * 0.4903927);
    fVar42 = in[7][1] * 0.4157349 + in[5][1] * 0.09754573 +
             (in[1][1] * 0.2777855 - in[3][1] * 0.4903927);
    fVar22 = (in[4][2] * 0.4157349 - in[6][2] * 0.4903927) +
             (in[0][2] * 0.09754573 - in[2][2] * 0.2777855);
    fVar34 = (in[4][3] * 0.4157349 - in[6][3] * 0.4903927) +
             (in[0][3] * 0.09754573 - in[2][3] * 0.2777855);
    fVar27 = (in[5][0] * 0.4157349 - in[7][0] * 0.4903927) +
             (in[1][0] * 0.09754573 - in[3][0] * 0.2777855);
    fVar30 = (in[5][1] * 0.4157349 - in[7][1] * 0.4903927) +
             (in[1][1] * 0.09754573 - in[3][1] * 0.2777855);
    fVar23 = (fStack_88 + in[3][2]) * 0.3535536;
    fVar25 = (fStack_84 + in[3][3]) * 0.3535536;
    fVar28 = (in[0][0] + in[4][0]) * 0.3535536;
    fVar31 = (in[0][1] + in[4][1]) * 0.3535536;
    fVar33 = (fStack_88 - in[3][2]) * 0.3535536;
    fVar35 = (fStack_84 - in[3][3]) * 0.3535536;
    fVar36 = (in[0][0] - in[4][0]) * 0.3535536;
    fVar38 = (in[0][1] - in[4][1]) * 0.3535536;
    fVar10 = fVar8 + fVar33;
    fVar12 = fVar9 + fVar35;
    fVar13 = fVar20 + fVar36;
    fVar7 = fVar21 + fVar38;
    fVar33 = fVar33 - fVar8;
    fVar35 = fVar35 - fVar9;
    fVar36 = fVar36 - fVar20;
    fVar38 = fVar38 - fVar21;
    fVar8 = fVar24 + fVar23;
    fVar9 = fVar26 + fVar25;
    fVar20 = fVar14 + fVar28;
    fVar21 = fVar15 + fVar31;
    fVar23 = fVar23 - fVar24;
    fVar25 = fVar25 - fVar26;
    fVar28 = fVar28 - fVar14;
    fVar31 = fVar31 - fVar15;
    pfVar2 = data + lVar4 * 4;
    *pfVar2 = fVar37 + fVar8;
    pfVar2[1] = fVar29 + fVar9;
    pfVar2[2] = fVar11 + fVar20;
    pfVar2[3] = fVar32 + fVar21;
    pfVar2 = data + lVar4 * 4 + 8;
    *pfVar2 = fVar16 + fVar10;
    pfVar2[1] = fVar17 + fVar12;
    pfVar2[2] = fVar18 + fVar13;
    pfVar2[3] = fVar19 + fVar7;
    pfVar2 = data + lVar4 * 4 + 0x10;
    *pfVar2 = fVar39 + fVar33;
    pfVar2[1] = fVar40 + fVar35;
    pfVar2[2] = fVar41 + fVar36;
    pfVar2[3] = fVar42 + fVar38;
    pfVar2 = data + lVar4 * 4 + 0x18;
    *pfVar2 = fVar22 + fVar23;
    pfVar2[1] = fVar34 + fVar25;
    pfVar2[2] = fVar27 + fVar28;
    pfVar2[3] = fVar30 + fVar31;
    pfVar2 = data + lVar4 * 4 + 0x20;
    *pfVar2 = fVar23 - fVar22;
    pfVar2[1] = fVar25 - fVar34;
    pfVar2[2] = fVar28 - fVar27;
    pfVar2[3] = fVar31 - fVar30;
    pfVar2 = data + lVar4 * 4 + 0x28;
    *pfVar2 = fVar33 - fVar39;
    pfVar2[1] = fVar35 - fVar40;
    pfVar2[2] = fVar36 - fVar41;
    pfVar2[3] = fVar38 - fVar42;
    pfVar2 = data + lVar4 * 4 + 0x30;
    *pfVar2 = fVar10 - fVar16;
    pfVar2[1] = fVar12 - fVar17;
    pfVar2[2] = fVar13 - fVar18;
    pfVar2[3] = fVar7 - fVar19;
    pfVar2 = data + lVar4 * 4 + 0x38;
    *pfVar2 = fVar8 - fVar37;
    pfVar2[1] = fVar9 - fVar29;
    pfVar2[2] = fVar20 - fVar11;
    pfVar2[3] = fVar21 - fVar32;
    pfVar5 = pfVar5 + 4;
  }
  return;
}

Assistant:

void
dctInverse8x8_sse2 (float* data)
{
#ifdef IMF_HAVE_SSE2
    __m128 a = {3.535536e-01f, 3.535536e-01f, 3.535536e-01f, 3.535536e-01f};
    __m128 b = {4.903927e-01f, 4.903927e-01f, 4.903927e-01f, 4.903927e-01f};
    __m128 c = {4.619398e-01f, 4.619398e-01f, 4.619398e-01f, 4.619398e-01f};
    __m128 d = {4.157349e-01f, 4.157349e-01f, 4.157349e-01f, 4.157349e-01f};
    __m128 e = {2.777855e-01f, 2.777855e-01f, 2.777855e-01f, 2.777855e-01f};
    __m128 f = {1.913422e-01f, 1.913422e-01f, 1.913422e-01f, 1.913422e-01f};
    __m128 g = {9.754573e-02f, 9.754573e-02f, 9.754573e-02f, 9.754573e-02f};

    __m128 c0 = {3.535536e-01f, 3.535536e-01f, 3.535536e-01f, 3.535536e-01f};
    __m128 c1 = {4.619398e-01f, 1.913422e-01f, -1.913422e-01f, -4.619398e-01f};
    __m128 c2 = {3.535536e-01f, -3.535536e-01f, -3.535536e-01f, 3.535536e-01f};
    __m128 c3 = {1.913422e-01f, -4.619398e-01f, 4.619398e-01f, -1.913422e-01f};

    __m128 c4 = {4.903927e-01f, 4.157349e-01f, 2.777855e-01f, 9.754573e-02f};
    __m128 c5 = {4.157349e-01f, -9.754573e-02f, -4.903927e-01f, -2.777855e-01f};
    __m128 c6 = {2.777855e-01f, -4.903927e-01f, 9.754573e-02f, 4.157349e-01f};
    __m128 c7 = {9.754573e-02f, -2.777855e-01f, 4.157349e-01f, -4.903927e-01f};

    __m128* srcVec = (__m128*) data;
    __m128  x[8], evenSum, oddSum;
    __m128  in[8], alpha[4], beta[4], theta[4], gamma[4];

    //
    // Rows -
    //
    //  Treat this just like matrix-vector multiplication. The
    //  trick is to note that:
    //
    //    [M00 M01 M02 M03][v0]   [(v0 M00) + (v1 M01) + (v2 M02) + (v3 M03)]
    //    [M10 M11 M12 M13][v1] = [(v0 M10) + (v1 M11) + (v2 M12) + (v3 M13)]
    //    [M20 M21 M22 M23][v2]   [(v0 M20) + (v1 M21) + (v2 M22) + (v3 M23)]
    //    [M30 M31 M32 M33][v3]   [(v0 M30) + (v1 M31) + (v2 M32) + (v3 M33)]
    //
    // Then, we can fill a register with v_i and multiply by the i-th column
    // of M, accumulating across all i-s.
    //
    // The kids refer to the populating of a register with a single value
    // "broadcasting", and it can be done with a shuffle instruction. It
    // seems to be the slowest part of the whole ordeal.
    //
    // Our matrix columns are stored above in c0-c7. c0-3 make up M1, and
    // c4-7 are from M2.
    //

#    define DCT_INVERSE_8x8_SS2_ROW_LOOP(i)                                    \
        /*                                                              \
             * Broadcast the components of the row                          \
             */      \
                                                                               \
        x[0] = _mm_shuffle_ps (                                                \
            srcVec[2 * i], srcVec[2 * i], _MM_SHUFFLE (0, 0, 0, 0));           \
                                                                               \
        x[1] = _mm_shuffle_ps (                                                \
            srcVec[2 * i], srcVec[2 * i], _MM_SHUFFLE (1, 1, 1, 1));           \
                                                                               \
        x[2] = _mm_shuffle_ps (                                                \
            srcVec[2 * i], srcVec[2 * i], _MM_SHUFFLE (2, 2, 2, 2));           \
                                                                               \
        x[3] = _mm_shuffle_ps (                                                \
            srcVec[2 * i], srcVec[2 * i], _MM_SHUFFLE (3, 3, 3, 3));           \
                                                                               \
        x[4] = _mm_shuffle_ps (                                                \
            srcVec[2 * i + 1], srcVec[2 * i + 1], _MM_SHUFFLE (0, 0, 0, 0));   \
                                                                               \
        x[5] = _mm_shuffle_ps (                                                \
            srcVec[2 * i + 1], srcVec[2 * i + 1], _MM_SHUFFLE (1, 1, 1, 1));   \
                                                                               \
        x[6] = _mm_shuffle_ps (                                                \
            srcVec[2 * i + 1], srcVec[2 * i + 1], _MM_SHUFFLE (2, 2, 2, 2));   \
                                                                               \
        x[7] = _mm_shuffle_ps (                                                \
            srcVec[2 * i + 1], srcVec[2 * i + 1], _MM_SHUFFLE (3, 3, 3, 3));   \
        /*                                                              \
             * Multiply the components by each column of the matrix         \
             */      \
                                                                               \
        x[0] = _mm_mul_ps (x[0], c0);                                          \
        x[2] = _mm_mul_ps (x[2], c1);                                          \
        x[4] = _mm_mul_ps (x[4], c2);                                          \
        x[6] = _mm_mul_ps (x[6], c3);                                          \
                                                                               \
        x[1] = _mm_mul_ps (x[1], c4);                                          \
        x[3] = _mm_mul_ps (x[3], c5);                                          \
        x[5] = _mm_mul_ps (x[5], c6);                                          \
        x[7] = _mm_mul_ps (x[7], c7);                                          \
                                                                               \
        /*                                                              \
             * Add across                                                   \
             */      \
                                                                               \
        evenSum = _mm_setzero_ps ();                                           \
        evenSum = _mm_add_ps (evenSum, x[0]);                                  \
        evenSum = _mm_add_ps (evenSum, x[2]);                                  \
        evenSum = _mm_add_ps (evenSum, x[4]);                                  \
        evenSum = _mm_add_ps (evenSum, x[6]);                                  \
                                                                               \
        oddSum = _mm_setzero_ps ();                                            \
        oddSum = _mm_add_ps (oddSum, x[1]);                                    \
        oddSum = _mm_add_ps (oddSum, x[3]);                                    \
        oddSum = _mm_add_ps (oddSum, x[5]);                                    \
        oddSum = _mm_add_ps (oddSum, x[7]);                                    \
                                                                               \
        /*                                                              \
             * Final Sum:                                                   \
             *    out [0, 1, 2, 3] = evenSum + oddSum                       \
             *    out [7, 6, 5, 4] = evenSum - oddSum                       \
             */      \
                                                                               \
        srcVec[2 * i]     = _mm_add_ps (evenSum, oddSum);                      \
        srcVec[2 * i + 1] = _mm_sub_ps (evenSum, oddSum);                      \
        srcVec[2 * i + 1] = _mm_shuffle_ps (                                   \
            srcVec[2 * i + 1], srcVec[2 * i + 1], _MM_SHUFFLE (0, 1, 2, 3))

    switch (zeroedRows)
    {
        case 0:
        default:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (6);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (7);
            break;

        case 1:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (6);
            break;

        case 2:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5);
            break;

        case 3:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4);
            break;

        case 4:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3);
            break;

        case 5:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2);
            break;

        case 6:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0);
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1);
            break;

        case 7: DCT_INVERSE_8x8_SS2_ROW_LOOP (0); break;
    }

#    undef DCT_INVERSE_8x8_SS2_ROW_LOOP
    //
    // Columns -
    //
    // This is slightly more straightforward, if less readable. Here
    // we just operate on 4 columns at a time, in two batches.
    //
    // The slight mess is to try and cache sub-expressions, which
    // we ignore in the row-wise pass.
    //

    for (int col = 0; col < 2; ++col)
    {

        for (int i = 0; i < 8; ++i)
            in[i] = srcVec[2 * i + col];

        alpha[0] = _mm_mul_ps (c, in[2]);
        alpha[1] = _mm_mul_ps (f, in[2]);
        alpha[2] = _mm_mul_ps (c, in[6]);
        alpha[3] = _mm_mul_ps (f, in[6]);

        beta[0] = _mm_add_ps (
            _mm_add_ps (_mm_mul_ps (in[1], b), _mm_mul_ps (in[3], d)),
            _mm_add_ps (_mm_mul_ps (in[5], e), _mm_mul_ps (in[7], g)));

        beta[1] = _mm_sub_ps (
            _mm_sub_ps (_mm_mul_ps (in[1], d), _mm_mul_ps (in[3], g)),
            _mm_add_ps (_mm_mul_ps (in[5], b), _mm_mul_ps (in[7], e)));

        beta[2] = _mm_add_ps (
            _mm_sub_ps (_mm_mul_ps (in[1], e), _mm_mul_ps (in[3], b)),
            _mm_add_ps (_mm_mul_ps (in[5], g), _mm_mul_ps (in[7], d)));

        beta[3] = _mm_add_ps (
            _mm_sub_ps (_mm_mul_ps (in[1], g), _mm_mul_ps (in[3], e)),
            _mm_sub_ps (_mm_mul_ps (in[5], d), _mm_mul_ps (in[7], b)));

        theta[0] = _mm_mul_ps (a, _mm_add_ps (in[0], in[4]));
        theta[3] = _mm_mul_ps (a, _mm_sub_ps (in[0], in[4]));

        theta[1] = _mm_add_ps (alpha[0], alpha[3]);
        theta[2] = _mm_sub_ps (alpha[1], alpha[2]);

        gamma[0] = _mm_add_ps (theta[0], theta[1]);
        gamma[1] = _mm_add_ps (theta[3], theta[2]);
        gamma[2] = _mm_sub_ps (theta[3], theta[2]);
        gamma[3] = _mm_sub_ps (theta[0], theta[1]);

        srcVec[col]     = _mm_add_ps (gamma[0], beta[0]);
        srcVec[2 + col] = _mm_add_ps (gamma[1], beta[1]);
        srcVec[4 + col] = _mm_add_ps (gamma[2], beta[2]);
        srcVec[6 + col] = _mm_add_ps (gamma[3], beta[3]);

        srcVec[8 + col]  = _mm_sub_ps (gamma[3], beta[3]);
        srcVec[10 + col] = _mm_sub_ps (gamma[2], beta[2]);
        srcVec[12 + col] = _mm_sub_ps (gamma[1], beta[1]);
        srcVec[14 + col] = _mm_sub_ps (gamma[0], beta[0]);
    }

#else /* IMF_HAVE_SSE2 */

    dctInverse8x8_scalar<zeroedRows> (data);

#endif /* IMF_HAVE_SSE2 */
}